

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcpal.c
# Opt level: O1

FT_Error tt_face_load_cpal(TT_Face face,FT_Stream stream)

{
  uint uVar1;
  FT_Memory memory;
  ushort uVar2;
  FT_Error FVar3;
  ushort *puVar4;
  FT_Color *pFVar5;
  ushort uVar6;
  long lVar7;
  ulong uVar8;
  ushort *puVar9;
  ushort uVar10;
  uint uVar11;
  ushort uVar12;
  uint uVar13;
  ushort *puVar15;
  FT_Error error;
  FT_Byte *table;
  FT_ULong table_size;
  FT_Error local_4c;
  ushort *local_48;
  ulong local_40;
  ulong local_38;
  ulong uVar14;
  
  memory = (face->root).memory;
  local_48 = (ushort *)0x0;
  local_4c = (*face->goto_table)(face,0x4350414c,stream,&local_40);
  if (local_4c == 0) {
    if (local_40 < 0xc) {
      puVar4 = (ushort *)0x0;
      goto LAB_0024a502;
    }
    local_4c = FT_Stream_ExtractFrame(stream,local_40,(FT_Byte **)&local_48);
    puVar9 = local_48;
    if (local_4c == 0) {
      puVar4 = (ushort *)ft_mem_alloc(memory,0x28,&local_4c);
      if (local_4c != 0) goto LAB_0024a50a;
      uVar6 = *puVar9 << 8 | *puVar9 >> 8;
      *puVar4 = uVar6;
      if (uVar6 < 2) {
        uVar10 = puVar9[1] << 8 | puVar9[1] >> 8;
        (face->palette_data).num_palette_entries = uVar10;
        uVar2 = puVar9[2] << 8 | puVar9[2] >> 8;
        (face->palette_data).num_palettes = uVar2;
        uVar12 = puVar9[3] << 8 | puVar9[3] >> 8;
        puVar4[1] = uVar12;
        if ((ulong)uVar2 * 2 + 0xc <= local_40) {
          uVar1 = *(uint *)(puVar9 + 4);
          uVar8 = (ulong)(uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                         uVar1 << 0x18);
          if (((uVar8 < local_40) && ((ulong)uVar12 << 2 <= local_40 - uVar8)) && (uVar10 <= uVar12)
             ) {
            *(ushort **)(puVar4 + 8) = puVar9 + 6;
            *(ulong *)(puVar4 + 4) = uVar8 + (long)local_48;
            if (uVar6 == 1) {
              if ((uint)uVar2 * 2 + 0x18 <= local_40) {
                uVar8 = (ulong)((uint)uVar2 * 2);
                uVar1 = *(uint *)((long)(puVar9 + 6) + uVar8);
                uVar11 = *(uint *)((long)puVar9 + uVar8 + 0x10);
                uVar13 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                         uVar1 << 0x18;
                uVar14 = (ulong)uVar13;
                uVar1 = *(uint *)((long)puVar9 + uVar8 + 0x14);
                if (uVar13 != 0) {
                  if ((local_40 <= uVar14) || (local_40 - uVar14 < uVar8)) goto LAB_0024a62b;
                  local_38 = (ulong)uVar11;
                  puVar4 = (ushort *)ft_mem_qrealloc(memory,2,0,(ulong)uVar2,(void *)0x0,&local_4c);
                  lVar7 = 2;
                  if (local_4c != 0) goto LAB_0024a630;
                  uVar6 = (face->palette_data).num_palettes;
                  if (uVar6 != 0) {
                    puVar15 = (ushort *)(uVar14 + (long)local_48);
                    puVar9 = puVar4;
                    do {
                      *puVar9 = *puVar15 << 8 | *puVar15 >> 8;
                      puVar9 = puVar9 + 1;
                      puVar15 = puVar15 + 1;
                    } while (puVar9 < puVar4 + uVar6);
                  }
                  (face->palette_data).palette_flags = puVar4;
                  uVar11 = (uint)local_38;
                }
                uVar8 = (ulong)(uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 |
                               uVar11 << 0x18);
                if (uVar8 == 0) {
LAB_0024a7cf:
                  uVar8 = (ulong)(uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                                 uVar1 << 0x18);
                  if (uVar8 != 0) {
                    if (local_40 <= uVar8) goto LAB_0024a62b;
                    uVar6 = (face->palette_data).num_palette_entries;
                    lVar7 = 3;
                    if (local_40 - uVar8 < (ulong)((uint)uVar6 + (uint)uVar6)) goto LAB_0024a630;
                    puVar4 = (ushort *)
                             ft_mem_qrealloc(memory,2,0,(ulong)uVar6,(void *)0x0,&local_4c);
                    lVar7 = 2;
                    if (local_4c != 0) goto LAB_0024a630;
                    uVar6 = (face->palette_data).num_palette_entries;
                    if (uVar6 != 0) {
                      puVar15 = (ushort *)(uVar8 + (long)local_48);
                      puVar9 = puVar4;
                      do {
                        *puVar9 = *puVar15 << 8 | *puVar15 >> 8;
                        puVar9 = puVar9 + 1;
                        puVar15 = puVar15 + 1;
                      } while (puVar9 < puVar4 + uVar6);
                    }
                    (face->palette_data).palette_entry_name_ids = puVar4;
                  }
                  lVar7 = 0;
                  goto LAB_0024a630;
                }
                if (uVar8 < local_40) {
                  uVar6 = (face->palette_data).num_palettes;
                  if ((ulong)((uint)uVar6 + (uint)uVar6) <= local_40 - uVar8) {
                    puVar4 = (ushort *)
                             ft_mem_qrealloc(memory,2,0,(ulong)uVar6,(void *)0x0,&local_4c);
                    lVar7 = 2;
                    if (local_4c != 0) goto LAB_0024a630;
                    uVar6 = (face->palette_data).num_palettes;
                    if (uVar6 != 0) {
                      puVar15 = (ushort *)(uVar8 + (long)local_48);
                      puVar9 = puVar4;
                      do {
                        *puVar9 = *puVar15 << 8 | *puVar15 >> 8;
                        puVar9 = puVar9 + 1;
                        puVar15 = puVar15 + 1;
                      } while (puVar9 < puVar4 + uVar6);
                    }
                    (face->palette_data).palette_name_ids = puVar4;
                    goto LAB_0024a7cf;
                  }
                }
              }
LAB_0024a62b:
              lVar7 = 3;
LAB_0024a630:
              FVar3 = (*(code *)((long)&DAT_00309d20 + (long)(int)(&DAT_00309d20)[lVar7]))();
              return FVar3;
            }
            *(ushort **)(puVar4 + 0xc) = local_48;
            *(ulong *)(puVar4 + 0x10) = local_40;
            face->cpal = puVar4;
            pFVar5 = (FT_Color *)
                     ft_mem_realloc(memory,4,0,(ulong)(face->palette_data).num_palette_entries,
                                    (void *)0x0,&local_4c);
            face->palette = pFVar5;
            if (local_4c != 0) goto LAB_0024a50a;
            FVar3 = tt_face_palette_set(face,0);
            if (FVar3 == 0) {
              return 0;
            }
          }
        }
      }
LAB_0024a502:
      local_4c = 8;
      goto LAB_0024a50a;
    }
  }
  puVar4 = (ushort *)0x0;
LAB_0024a50a:
  FT_Stream_ReleaseFrame(stream,(FT_Byte **)&local_48);
  ft_mem_free(memory,puVar4);
  face->cpal = (void *)0x0;
  return local_4c;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  tt_face_load_cpal( TT_Face    face,
                     FT_Stream  stream )
  {
    FT_Error   error;
    FT_Memory  memory = face->root.memory;

    FT_Byte*  table = NULL;
    FT_Byte*  p     = NULL;

    Cpal*  cpal = NULL;

    FT_ULong  colors_offset;
    FT_ULong  table_size;


    error = face->goto_table( face, TTAG_CPAL, stream, &table_size );
    if ( error )
      goto NoCpal;

    if ( table_size < CPAL_V0_HEADER_BASE_SIZE )
      goto InvalidTable;

    if ( FT_FRAME_EXTRACT( table_size, table ) )
      goto NoCpal;

    p = table;

    if ( FT_NEW( cpal ) )
      goto NoCpal;

    cpal->version = FT_NEXT_USHORT( p );
    if ( cpal->version > 1 )
      goto InvalidTable;

    face->palette_data.num_palette_entries = FT_NEXT_USHORT( p );
    face->palette_data.num_palettes        = FT_NEXT_USHORT( p );

    cpal->num_colors = FT_NEXT_USHORT( p );
    colors_offset    = FT_NEXT_ULONG( p );

    if ( CPAL_V0_HEADER_BASE_SIZE             +
         face->palette_data.num_palettes * 2U > table_size )
      goto InvalidTable;

    if ( colors_offset >= table_size )
      goto InvalidTable;
    if ( cpal->num_colors * COLOR_SIZE > table_size - colors_offset )
      goto InvalidTable;

    if ( face->palette_data.num_palette_entries > cpal->num_colors )
      goto InvalidTable;

    cpal->color_indices = p;
    cpal->colors        = (FT_Byte*)( table + colors_offset );

    if ( cpal->version == 1 )
    {
      FT_ULong    type_offset, label_offset, entry_label_offset;
      FT_UShort*  array = NULL;
      FT_UShort*  limit;
      FT_UShort*  q;


      if ( CPAL_V0_HEADER_BASE_SIZE             +
           face->palette_data.num_palettes * 2U +
           3U * 4                               > table_size )
        goto InvalidTable;

      p += face->palette_data.num_palettes * 2U;

      type_offset        = FT_NEXT_ULONG( p );
      label_offset       = FT_NEXT_ULONG( p );
      entry_label_offset = FT_NEXT_ULONG( p );

      if ( type_offset )
      {
        if ( type_offset >= table_size )
          goto InvalidTable;
        if ( face->palette_data.num_palettes * 2U >
               table_size - type_offset )
          goto InvalidTable;

        if ( FT_QNEW_ARRAY( array, face->palette_data.num_palettes ) )
          goto NoCpal;

        p     = table + type_offset;
        q     = array;
        limit = q + face->palette_data.num_palettes;

        while ( q < limit )
          *q++ = FT_NEXT_USHORT( p );

        face->palette_data.palette_flags = array;
      }

      if ( label_offset )
      {
        if ( label_offset >= table_size )
          goto InvalidTable;
        if ( face->palette_data.num_palettes * 2U >
               table_size - label_offset )
          goto InvalidTable;

        if ( FT_QNEW_ARRAY( array, face->palette_data.num_palettes ) )
          goto NoCpal;

        p     = table + label_offset;
        q     = array;
        limit = q + face->palette_data.num_palettes;

        while ( q < limit )
          *q++ = FT_NEXT_USHORT( p );

        face->palette_data.palette_name_ids = array;
      }

      if ( entry_label_offset )
      {
        if ( entry_label_offset >= table_size )
          goto InvalidTable;
        if ( face->palette_data.num_palette_entries * 2U >
               table_size - entry_label_offset )
          goto InvalidTable;

        if ( FT_QNEW_ARRAY( array, face->palette_data.num_palette_entries ) )
          goto NoCpal;

        p     = table + entry_label_offset;
        q     = array;
        limit = q + face->palette_data.num_palette_entries;

        while ( q < limit )
          *q++ = FT_NEXT_USHORT( p );

        face->palette_data.palette_entry_name_ids = array;
      }
    }

    cpal->table      = table;
    cpal->table_size = table_size;

    face->cpal = cpal;

    /* set up default palette */
    if ( FT_NEW_ARRAY( face->palette,
                       face->palette_data.num_palette_entries ) )
      goto NoCpal;

    if ( tt_face_palette_set( face, 0 ) )
      goto InvalidTable;

    return FT_Err_Ok;

  InvalidTable:
    error = FT_THROW( Invalid_Table );

  NoCpal:
    FT_FRAME_RELEASE( table );
    FT_FREE( cpal );

    face->cpal = NULL;

    /* arrays in `face->palette_data' and `face->palette' */
    /* are freed in `sfnt_done_face'                      */

    return error;
  }